

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O2

bool httplib::detail::read_content<httplib::Request>
               (Stream *strm,Request *x,size_t payload_max_length,int *status,Progress *progress,
               ContentReceiverWithProgress *receiver,bool decompress)

{
  _Manager_type p_Var1;
  ContentReceiverWithProgress receiver_00;
  anon_class_40_5_1ac14285 callback;
  bool bVar2;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 uVar3;
  undefined8 uVar4;
  _Manager_type p_Var5;
  size_t local_38;
  Request *local_30;
  Stream *pSStack_28;
  _Manager_type local_20;
  Progress *pPStack_18;
  int *local_10;
  
  uVar3 = (void *)0x0;
  uVar4 = 0;
  p_Var1 = (receiver->super__Function_base)._M_manager;
  p_Var5 = (_Manager_type)0x0;
  if (p_Var1 != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)&(receiver->super__Function_base)._M_functor;
    uVar4 = *(undefined8 *)((long)&(receiver->super__Function_base)._M_functor + 8);
    (receiver->super__Function_base)._M_manager = (_Manager_type)0x0;
    receiver->_M_invoker = (_Invoker_type)0x0;
    p_Var5 = p_Var1;
  }
  local_20 = (_Manager_type)&local_38;
  receiver_00.super__Function_base._M_functor._8_8_ = strm;
  receiver_00.super__Function_base._M_functor._M_unused._M_object = x;
  receiver_00.super__Function_base._M_manager = local_20;
  receiver_00._M_invoker = (_Invoker_type)progress;
  callback.strm = (Stream *)in_stack_ffffffffffffffa0;
  callback.x = (Request *)status;
  callback.payload_max_length = (size_t *)uVar3;
  callback.progress = (Progress *)uVar4;
  callback.status = (int *)p_Var5;
  local_38 = payload_max_length;
  local_30 = x;
  pSStack_28 = strm;
  pPStack_18 = progress;
  local_10 = status;
  bVar2 = prepare_content_receiver<httplib::Request,httplib::detail::read_content<httplib::Request>(httplib::Stream&,httplib::Request&,unsigned_long,int&,std::function<bool(unsigned_long,unsigned_long)>,std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>,bool)::_lambda(std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>const&)_1_>
                    (x,status,receiver_00,SUB81(&stack0xffffffffffffffa8,0),callback);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffffa8);
  return bVar2;
}

Assistant:

bool read_content(Stream& strm, T& x, size_t payload_max_length, int& status,
            Progress progress, ContentReceiverWithProgress receiver,
            bool decompress) {
            return prepare_content_receiver(
                x, status, std::move(receiver), decompress,
                [&](const ContentReceiverWithProgress& out) {
                    auto ret = true;
                    auto exceed_payload_max_length = false;

                    if (is_chunked_transfer_encoding(x.headers)) {
                        ret = read_content_chunked(strm, out);
                    }
                    else if (!has_header(x.headers, "Content-Length")) {
                        ret = read_content_without_length(strm, out);
                    }
                    else {
                        auto len = get_header_value<uint64_t>(x.headers, "Content-Length");
                        if (len > payload_max_length) {
                            exceed_payload_max_length = true;
                            skip_content_with_length(strm, len);
                            ret = false;
                        }
                        else if (len > 0) {
                            ret = read_content_with_length(strm, len, std::move(progress), out);
                        }
                    }

                    if (!ret) { status = exceed_payload_max_length ? 413 : 400; }
                    return ret;
                });
        }